

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O1

cx_string<26UL> * __thiscall
mserialize::cx_strcat<8ul,6ul,2ul,8ul,1ul,1ul>
          (cx_string<26UL> *__return_storage_ptr__,mserialize *this,cx_string<8UL> *strings,
          cx_string<6UL> *strings_1,cx_string<2UL> *strings_2,cx_string<8UL> *strings_3,
          cx_string<1UL> *strings_4,cx_string<1UL> *strings_5)

{
  long lVar1;
  ulong uVar2;
  char **ppcVar3;
  ulong local_a8 [5];
  size_t size [7];
  char *data [7];
  
  ppcVar3 = data + 3;
  data[5]._0_2_ = 0;
  data[5]._2_1_ = 0;
  data._43_7_ = 0;
  data[3] = (char *)0x0;
  data[4]._0_2_ = 0;
  data[4]._2_1_ = 0;
  data[4]._3_5_ = 0;
  size[4] = (size_t)this;
  size[5] = (size_t)strings;
  size[6] = (size_t)strings_1;
  data[0] = strings_3->_data;
  data[1] = strings_4->_data;
  local_a8[1] = 8;
  local_a8[2] = 6;
  local_a8[3] = 2;
  local_a8[4] = 8;
  lVar1 = 1;
  size[0] = 1;
  size[1] = 1;
  do {
    if (local_a8[lVar1] != 0) {
      uVar2 = 0;
      do {
        *(undefined1 *)((long)ppcVar3 + uVar2) = *(undefined1 *)(size[lVar1 + 3] + uVar2);
        uVar2 = uVar2 + 1;
      } while (uVar2 < local_a8[lVar1]);
      ppcVar3 = (char **)((long)ppcVar3 + uVar2);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 7);
  __return_storage_ptr__->_data[0x1a] = '\0';
  *(char **)__return_storage_ptr__->_data = data[3];
  *(ulong *)(__return_storage_ptr__->_data + 8) =
       CONCAT53(data[4]._3_5_,CONCAT12(data[4]._2_1_,data[4]._0_2_));
  *(ulong *)(__return_storage_ptr__->_data + 10) =
       CONCAT26(data[5]._0_2_,CONCAT51(data[4]._3_5_,data[4]._2_1_));
  *(ulong *)(__return_storage_ptr__->_data + 0x12) = CONCAT71(data._43_7_,data[5]._2_1_);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}